

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_fence_wait(ma_fence *pFence)

{
  ma_result result;
  ma_uint32 counter;
  ma_fence *pFence_local;
  
  if (pFence == (ma_fence *)0x0) {
    pFence_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    do {
      if (pFence->counter == 0) {
        return MA_SUCCESS;
      }
      pFence_local._4_4_ = ma_event_wait(&pFence->e);
    } while (pFence_local._4_4_ == MA_SUCCESS);
  }
  return pFence_local._4_4_;
}

Assistant:

MA_API ma_result ma_fence_wait(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        ma_uint32 counter;

        counter = c89atomic_load_32(&pFence->counter);
        if (counter == 0) {
            /*
            Counter has hit zero. By the time we get here some other thread may have acquired the
            fence again, but that is where the caller needs to take care with how they se the fence.
            */
            return MA_SUCCESS;
        }

        /* Getting here means the counter is > 0. We'll need to wait for something to happen. */
        #ifndef MA_NO_THREADING
        {
            ma_result result;

            result = ma_event_wait(&pFence->e);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
        #endif
    }

    /* Should never get here. */
    /*return MA_INVALID_OPERATION;*/
}